

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_list.cpp
# Opt level: O3

void __thiscall Am_Value_List_Data::Print(Am_Value_List_Data *this,ostream *os)

{
  ostream *poVar1;
  Am_List_Item *value;
  Am_Value v;
  Am_Value local_30;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"LIST(",5);
  poVar1 = (ostream *)
           std::ostream::operator<<(os,(uint)*(ushort *)&(this->super_Am_Wrapper).field_0xc);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,") [",3);
  local_30.type = 0;
  local_30.value.wrapper_value = (Am_Wrapper *)0x0;
  value = this->head;
  if (value != this->tail) {
    do {
      poVar1 = ::operator<<(os,&value->super_Am_Value);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
      value = value->next;
    } while (value != this->tail);
  }
  if (value != (Am_List_Item *)0x0) {
    ::operator<<(os,&value->super_Am_Value);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"]",1);
  Am_Value::~Am_Value(&local_30);
  return;
}

Assistant:

void
Am_Value_List_Data::Print(std::ostream &os) const
{
  Am_List_Item *current;
  os << "LIST(" << (int)number << ") [";
  Am_Value v;
  for (current = head; current != tail; current = current->next) {
    os << *current << ", ";
  }
  if (current) {
    os << *current;
  }
  os << "]";
}